

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_123::AsyncTee::ReadSink::fill
          (ReadSink *this,Buffer *inBuffer,
          Maybe<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>_> *stoppage)

{
  char *pcVar1;
  uint64_t uVar2;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  _Elt_pointer value;
  Exception local_1b0;
  
  pcVar1 = (char *)CONCAT71(in_register_00000009,in_CL);
  uVar2 = Buffer::consume((Buffer *)stoppage,
                          (ArrayPtr<unsigned_char> *)
                          &(inBuffer->bufferList).
                           super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_first,
                          (size_t *)
                          &(inBuffer->bufferList).
                           super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_node);
  value = (_Elt_pointer)
          ((long)&((inBuffer->bufferList).
                   super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur)->ptr + uVar2);
  (inBuffer->bufferList).
  super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = value;
  if ((inBuffer->bufferList).
      super__Deque_base<kj::Array<unsigned_char>,_std::allocator<kj::Array<unsigned_char>_>_>.
      _M_impl.super__Deque_impl_data._M_start._M_node != (_Map_pointer)0x0) {
    if (((uVar2 != 0) ||
        (*(long *)((long)&(stoppage->ptr).field_1 + 0x28) !=
         *(long *)((long)&(stoppage->ptr).field_1 + 8))) || (*pcVar1 != '\x01')) goto LAB_003798c6;
    if (*(int *)(pcVar1 + 8) != 1 && value == (_Elt_pointer)0x0) {
      Exception::Exception(&local_1b0,(Exception *)(pcVar1 + 0x10));
      SinkBase<unsigned_long>::reject((SinkBase<unsigned_long> *)inBuffer,&local_1b0);
      Exception::~Exception(&local_1b0);
      goto LAB_003798c6;
    }
  }
  SinkBase<unsigned_long>::fulfill<unsigned_long>
            ((SinkBase<unsigned_long> *)inBuffer,(unsigned_long)value);
LAB_003798c6:
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> fill(Buffer& inBuffer, const Maybe<Stoppage>& stoppage) override {
      auto amount = inBuffer.consume(buffer, minBytes);
      readSoFar += amount;

      if (minBytes == 0) {
        // We satisfied the read request.
        fulfill(readSoFar);
        return READY_NOW;
      }

      if (amount == 0 && inBuffer.empty()) {
        // We made no progress on the read request and the buffer is tapped out.
        KJ_IF_SOME(reason, stoppage) {
          if (reason.is<Eof>() || readSoFar > 0) {
            // Prefer short read to exception.
            fulfill(readSoFar);
          } else {
            reject(cp(reason.get<Exception>()));
          }
          return READY_NOW;
        }
      }

      return READY_NOW;
    }